

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_scan_line(Parser *this)

{
  csubstr stripped_;
  csubstr full_;
  basic_substring<char> *this_00;
  long lVar1;
  char *s_;
  long in_RDI;
  size_t in_stack_00000050;
  LineContents *in_stack_00000058;
  csubstr in_stack_00000060;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  undefined6 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 uVar2;
  undefined1 in_stack_ffffffffffffff27;
  
  if (*(ulong *)(*(long *)(in_RDI + 0x9f0) + 0x30) < *(ulong *)(in_RDI + 0x20)) {
    basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x2fa0fb);
    LineContents::reset_with_next_line(in_stack_00000058,in_stack_00000060,in_stack_00000050);
  }
  else {
    s_ = (char *)(*(long *)(in_RDI + 0x9f0) + 0x58);
    this_00 = (basic_substring<char> *)(in_RDI + 0x18);
    basic_substring<char>::basic_substring
              (this_00,s_,
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
    basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x2f9f56);
    lVar1 = in_RDI + 0x18;
    uVar2 = 1;
    basic_substring<char>::basic_substring
              (this_00,s_,CONCAT17(in_stack_ffffffffffffff27,CONCAT16(1,in_stack_ffffffffffffff20)))
    ;
    basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x2fa0ae);
    full_.len = (size_t)this_00;
    full_.str = s_;
    stripped_.len._0_6_ = in_stack_ffffffffffffff20;
    stripped_.str = (char *)lVar1;
    stripped_.len._6_1_ = uVar2;
    stripped_.len._7_1_ = in_stack_ffffffffffffff27;
    LineContents::reset((LineContents *)
                        CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),full_,
                        stripped_);
  }
  return;
}

Assistant:

void Parser::_scan_line()
{
    if(m_state->pos.offset >= m_buf.len)
    {
        m_state->line_contents.reset(m_buf.last(0), m_buf.last(0));
        return;
    }
    m_state->line_contents.reset_with_next_line(m_buf, m_state->pos.offset);
}